

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIndexedStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformBufferBufferCase::testUniformBuffers
          (UniformBufferBufferCase *this)

{
  GLenum target;
  GLuint index;
  TestContext *testCtx;
  GLint64 expected;
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  long *plVar6;
  undefined1 local_238 [8];
  StateQueryMemoryWriteGuard<long> state;
  GLuint local_218;
  int ndx;
  BufferRequirements requirements [4];
  GLuint buffers [2];
  int rangeBufferTotalSize;
  int rangeBufferSize;
  int rangeBufferOffset;
  MessageBuilder local_1b8;
  int local_34;
  GLuint local_30;
  GLint alignment;
  GLuint uniformIndices [2];
  char *uniformNames [2];
  UniformBufferBufferCase *this_local;
  
  uniformIndices = (GLuint  [2])anon_var_dwarf_4419a9;
  memset(&local_30,0,8);
  glu::CallLogWrapper::glGetUniformIndices
            (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,
             (this->super_UniformBufferCase).m_program,2,(GLchar **)uniformIndices,&local_30);
  local_34 = GetAlignment(this);
  if (local_34 != -1) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase
                         .super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [14])"Alignment is ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_34);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    iVar2 = local_34;
    iVar4 = local_34 * 2;
    iVar1 = local_34 * 3;
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,2,
               (GLuint *)&requirements[3].value);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,0x8a11,
               (GLuint)requirements[3].value);
    glu::CallLogWrapper::glBufferData
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,0x8a11,0x20,
               (void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,0x8a11,local_30,
               (GLuint)requirements[3].value);
    ApiCase::expectError((ApiCase *)this,0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,0x8a11,
               requirements[3].value._4_4_);
    glu::CallLogWrapper::glBufferData
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,0x8a11,
               (long)(iVar1 + 8),(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBufferRange
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,0x8a11,alignment,
               requirements[3].value._4_4_,(long)iVar2,(long)iVar4);
    ApiCase::expectError((ApiCase *)this,0);
    local_218 = local_30;
    ndx = 0x8a29;
    requirements[0].index = 0;
    requirements[0].pname = 0;
    requirements[0].value._0_4_ = local_30;
    requirements[0].value._4_4_ = 0x8a2a;
    requirements[1].index = 0;
    requirements[1].pname = 0;
    requirements[1].value._0_4_ = alignment;
    requirements[1].value._4_4_ = 0x8a29;
    requirements[2]._0_8_ = SEXT48(iVar2);
    requirements[2].value._0_4_ = alignment;
    requirements[2].value._4_4_ = 0x8a2a;
    requirements[3]._0_8_ = SEXT48(iVar4);
    for (state.m_postguard._4_4_ = 0; state.m_postguard._4_4_ < 4;
        state.m_postguard._4_4_ = state.m_postguard._4_4_ + 1) {
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
                ((StateQueryMemoryWriteGuard<long> *)local_238);
      target = *(GLenum *)((long)&requirements[(long)state.m_postguard._4_4_ + -1].value + 4);
      index = (&local_218)[(long)state.m_postguard._4_4_ * 4];
      plVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::operator&
                         ((StateQueryMemoryWriteGuard<long> *)local_238);
      glu::CallLogWrapper::glGetInteger64i_v
                (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,target,index,
                 plVar6);
      bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                        ((StateQueryMemoryWriteGuard<long> *)local_238,
                         (this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase
                         .super_TestNode.m_testCtx);
      if (bVar3) {
        testCtx = (this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx;
        plVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_long_
                           ((StateQueryMemoryWriteGuard *)local_238);
        expected._0_4_ = requirements[state.m_postguard._4_4_].index;
        expected._4_4_ = requirements[state.m_postguard._4_4_].pname;
        checkIntEquals(testCtx,*plVar6,expected);
      }
      ApiCase::expectError((ApiCase *)this,0);
    }
    glu::CallLogWrapper::glDeleteBuffers
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,2,
               (GLuint *)&requirements[3].value);
  }
  return;
}

Assistant:

void testUniformBuffers (void)
	{
		const char* uniformNames[] =
		{
			"input1",
			"input2"
		};
		GLuint uniformIndices[2] = {0};
		glGetUniformIndices(m_program, 2, uniformNames, uniformIndices);

		const GLint alignment = GetAlignment();
		if (alignment == -1) // cannot continue without this
			return;

		m_testCtx.getLog() << tcu::TestLog::Message << "Alignment is " << alignment << tcu::TestLog::EndMessage;

		int rangeBufferOffset		= alignment;
		int rangeBufferSize			= alignment * 2;
		int rangeBufferTotalSize	= rangeBufferOffset + rangeBufferSize + 8; // + 8 has no special meaning, just to make it != with the size of the range

		GLuint buffers[2];
		glGenBuffers(2, buffers);

		glBindBuffer(GL_UNIFORM_BUFFER, buffers[0]);
		glBufferData(GL_UNIFORM_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
		glBindBufferBase(GL_UNIFORM_BUFFER, uniformIndices[0], buffers[0]);
		expectError(GL_NO_ERROR);

		glBindBuffer(GL_UNIFORM_BUFFER, buffers[1]);
		glBufferData(GL_UNIFORM_BUFFER, rangeBufferTotalSize, DE_NULL, GL_DYNAMIC_DRAW);
		glBindBufferRange(GL_UNIFORM_BUFFER, uniformIndices[1], buffers[1], rangeBufferOffset, rangeBufferSize);
		expectError(GL_NO_ERROR);

		// test UNIFORM_BUFFER_START and UNIFORM_BUFFER_SIZE

		const struct BufferRequirements
		{
			GLuint	index;
			GLenum	pname;
			GLint64 value;
		} requirements[] =
		{
			{ uniformIndices[0], GL_UNIFORM_BUFFER_START,	0					},
			{ uniformIndices[0], GL_UNIFORM_BUFFER_SIZE,	0					},
			{ uniformIndices[1], GL_UNIFORM_BUFFER_START,	rangeBufferOffset	},
			{ uniformIndices[1], GL_UNIFORM_BUFFER_SIZE,	rangeBufferSize		}
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requirements); ++ndx)
		{
			StateQueryMemoryWriteGuard<GLint64> state;
			glGetInteger64i_v(requirements[ndx].pname, requirements[ndx].index, &state);

			if (state.verifyValidity(m_testCtx))
				checkIntEquals(m_testCtx, state, requirements[ndx].value);
			expectError(GL_NO_ERROR);
		}

		glDeleteBuffers(2, buffers);
	}